

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_ffb3f::generateRandomFile(int partCount)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  reference pvVar8;
  size_type sVar9;
  ostream *this;
  reference pvVar10;
  uint *puVar11;
  int in_EDI;
  int k_1;
  int j_1;
  DeepFrameBuffer frameBuffer_3;
  int h_1;
  int w_1;
  int yLevel_1;
  int xLevel_1;
  int numYLevels_1;
  int numXLevels_1;
  DeepTiledOutputPart part_3;
  int k;
  int j;
  DeepFrameBuffer frameBuffer_2;
  DeepScanLineOutputPart part_2;
  FrameBuffer frameBuffer_1;
  int h;
  int w;
  int yLevel;
  int xLevel;
  int numYLevels;
  int numXLevels;
  TiledOutputPart part_1;
  FrameBuffer frameBuffer;
  OutputPart part;
  int i;
  MultiPartOutputFile file;
  vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_> outputfiles;
  Array2D<unsigned_int_*> deepUintData;
  Array2D<float_*> deepFloatData;
  Array2D<Imath_3_2::half_*> deepHalfData;
  Array2D<unsigned_int> sampleCount;
  Array2D<unsigned_int> uintData;
  Array2D<float> floatData;
  Array2D<Imath_3_2::half> halfData;
  int in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  int in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  int in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  DeepFrameBuffer *in_stack_fffffffffffffc70;
  Slice local_2f0 [28];
  int in_stack_fffffffffffffd2c;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffd30;
  Array2D<float_*> *in_stack_fffffffffffffd38;
  Array2D<unsigned_int_*> *in_stack_fffffffffffffd40;
  int local_2b8;
  int in_stack_fffffffffffffd4c;
  DeepFrameBuffer *in_stack_fffffffffffffd50;
  int local_240;
  int local_23c;
  undefined1 local_230 [64];
  int local_1f0;
  int local_1ec;
  Slice local_1e8 [104];
  undefined1 local_180 [80];
  FrameBuffer local_130;
  undefined1 local_f8 [56];
  Array2D<unsigned_int_*> local_c0;
  Array2D<float_*> local_a8;
  Array2D<Imath_3_2::half_*> local_90;
  Array2D<unsigned_int> local_78;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  Array2D<float> local_38;
  Array2D<Imath_3_2::half> local_20;
  int local_4;
  
  local_4 = in_EDI;
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&local_20);
  Imf_3_2::Array2D<float>::Array2D(&local_38);
  Imf_3_2::Array2D<unsigned_int>::Array2D((Array2D<unsigned_int> *)&stack0xffffffffffffffa0);
  Imf_3_2::Array2D<unsigned_int>::Array2D(&local_78);
  Imf_3_2::Array2D<Imath_3_2::half_*>::Array2D(&local_90);
  Imf_3_2::Array2D<float_*>::Array2D(&local_a8);
  Imf_3_2::Array2D<unsigned_int_*>::Array2D(&local_c0);
  std::vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>::vector
            ((vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_> *)
             0x1b8642);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  generateRandomHeaders(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  remove(pcVar7);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  pvVar8 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                     ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                      (anonymous_namespace)::headers,0);
  sVar9 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::size
                    ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                     (anonymous_namespace)::headers);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)(local_f8 + 0x10),pcVar7,pvVar8,(int)sVar9,false,iVar2);
  this = std::operator<<((ostream *)&std::cout,"Writing files ");
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  for (local_f8._12_4_ = 0; (int)local_f8._12_4_ < local_4; local_f8._12_4_ = local_f8._12_4_ + 1) {
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                         (long)(int)local_f8._12_4_);
    switch(*pvVar10) {
    case 0:
      Imf_3_2::OutputPart::OutputPart
                ((OutputPart *)local_f8,(MultiPartOutputFile *)(local_f8 + 0x10),local_f8._12_4_);
      Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1b88c2);
      fillPixels<unsigned_int>
                ((Array2D<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
      fillPixels<float>((Array2D<float> *)
                        CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                        in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
      fillPixels<Imath_3_2::half>
                ((Array2D<Imath_3_2::half> *)
                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                 (long)(int)local_f8._12_4_);
      setOutputFrameBuffer
                ((FrameBuffer *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                 (Array2D<unsigned_int> *)in_stack_fffffffffffffd40,
                 (Array2D<float> *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                 in_stack_fffffffffffffd2c);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)local_f8);
      Imf_3_2::OutputPart::writePixels((int)local_f8);
      Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1b897f);
      break;
    case 1:
      Imf_3_2::TiledOutputPart::TiledOutputPart
                ((TiledOutputPart *)&local_130,(MultiPartOutputFile *)(local_f8 + 0x10),
                 local_f8._12_4_);
      local_180._76_4_ = Imf_3_2::TiledOutputPart::numXLevels();
      local_180._72_4_ = Imf_3_2::TiledOutputPart::numYLevels();
      for (local_180._68_4_ = 0; (int)local_180._68_4_ < (int)local_180._76_4_;
          local_180._68_4_ = local_180._68_4_ + 1) {
        for (local_180._64_4_ = 0; (int)local_180._64_4_ < (int)local_180._72_4_;
            local_180._64_4_ = local_180._64_4_ + 1) {
          bVar1 = Imf_3_2::TiledOutputPart::isValidLevel((int)&local_130,local_180._68_4_);
          if ((bVar1 & 1) != 0) {
            local_180._60_4_ = Imf_3_2::TiledOutputPart::levelWidth((int)&local_130);
            local_180._56_4_ = Imf_3_2::TiledOutputPart::levelHeight((int)&local_130);
            Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1b8ae1);
            fillPixels<unsigned_int>
                      ((Array2D<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
            fillPixels<float>((Array2D<float> *)
                              CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                              in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
            fillPixels<Imath_3_2::half>
                      ((Array2D<Imath_3_2::half> *)
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                       (long)(int)local_f8._12_4_);
            setOutputFrameBuffer
                      ((FrameBuffer *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                       (Array2D<unsigned_int> *)in_stack_fffffffffffffd40,
                       (Array2D<float> *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd2c);
            Imf_3_2::TiledOutputPart::setFrameBuffer(&local_130);
            iVar2 = Imf_3_2::TiledOutputPart::numXTiles((int)&local_130);
            iVar3 = Imf_3_2::TiledOutputPart::numYTiles((int)&local_130);
            Imf_3_2::TiledOutputPart::writeTiles
                      ((int)&local_130,0,iVar2 + -1,0,iVar3 + -1,local_180._68_4_);
            Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1b8c12);
          }
        }
      }
      break;
    case 2:
      Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                ((DeepScanLineOutputPart *)local_180,(MultiPartOutputFile *)(local_f8 + 0x10),
                 local_f8._12_4_);
      Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffc70);
      Imf_3_2::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)in_stack_fffffffffffffc70,
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      for (local_1ec = 0; local_1ec < 0x10; local_1ec = local_1ec + 1) {
        for (local_1f0 = 0; local_1f0 < 0x10; local_1f0 = local_1f0 + 1) {
          iVar2 = local_1ec * 0x10 + local_1f0;
          puVar11 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_78,(long)local_1ec);
          puVar11[local_1f0] = iVar2 % 10 + 1;
        }
      }
      puVar11 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_78,0);
      in_stack_fffffffffffffc58 = 0;
      in_stack_fffffffffffffc50 = 0;
      Imf_3_2::Slice::Slice
                ((Slice *)(local_230 + 8),UINT,(char *)puVar11,4,0x40,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_1e8);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)(int)local_f8._12_4_);
      if (*pvVar10 == 0) {
        fillPixels<unsigned_int>
                  ((Array2D<unsigned_int> *)in_stack_fffffffffffffc70,
                   (Array2D<unsigned_int_*> *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                   in_stack_fffffffffffffc64,in_stack_fffffffffffffc60);
      }
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)(int)local_f8._12_4_);
      if (*pvVar10 == 1) {
        fillPixels<float>((Array2D<unsigned_int> *)in_stack_fffffffffffffc70,
                          (Array2D<float_*> *)
                          CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                          in_stack_fffffffffffffc64,in_stack_fffffffffffffc60);
      }
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)(int)local_f8._12_4_);
      if (*pvVar10 == 2) {
        fillPixels<Imath_3_2::half>
                  ((Array2D<unsigned_int> *)in_stack_fffffffffffffc70,
                   (Array2D<Imath_3_2::half_*> *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                   in_stack_fffffffffffffc64,in_stack_fffffffffffffc60);
      }
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                 (long)(int)local_f8._12_4_);
      setOutputDeepFrameBuffer
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd40,
                 in_stack_fffffffffffffd38,(Array2D<Imath_3_2::half_*> *)in_stack_fffffffffffffd30,
                 in_stack_fffffffffffffd2c);
      Imf_3_2::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)local_180);
      Imf_3_2::DeepScanLineOutputPart::writePixels((int)local_180);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                 (long)(int)local_f8._12_4_);
      releasePixels((int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                    (Array2D<unsigned_int_*> *)
                    CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                    (Array2D<float_*> *)
                    CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (Array2D<Imath_3_2::half_*> *)
                    CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1b8f6d);
      break;
    case 3:
      Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart
                ((DeepTiledOutputPart *)local_230,(MultiPartOutputFile *)(local_f8 + 0x10),
                 local_f8._12_4_);
      iVar2 = Imf_3_2::DeepTiledOutputPart::numXLevels();
      iVar3 = Imf_3_2::DeepTiledOutputPart::numYLevels();
      for (local_23c = 0; local_23c < iVar2; local_23c = local_23c + 1) {
        for (local_240 = 0; local_240 < iVar3; local_240 = local_240 + 1) {
          bVar1 = Imf_3_2::DeepTiledOutputPart::isValidLevel((int)local_230,local_23c);
          if ((bVar1 & 1) != 0) {
            iVar4 = Imf_3_2::DeepTiledOutputPart::levelWidth((int)local_230);
            iVar5 = Imf_3_2::DeepTiledOutputPart::levelHeight((int)local_230);
            Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffc70);
            Imf_3_2::Array2D<unsigned_int>::resizeErase
                      ((Array2D<unsigned_int> *)in_stack_fffffffffffffc70,
                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            for (in_stack_fffffffffffffd4c = 0; in_stack_fffffffffffffd4c < iVar5;
                in_stack_fffffffffffffd4c = in_stack_fffffffffffffd4c + 1) {
              for (local_2b8 = 0; local_2b8 < iVar4; local_2b8 = local_2b8 + 1) {
                iVar6 = in_stack_fffffffffffffd4c * iVar4;
                puVar11 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                    (&local_78,(long)in_stack_fffffffffffffd4c);
                puVar11[local_2b8] = (iVar6 + local_2b8) % 10 + 1;
              }
            }
            in_stack_fffffffffffffc70 =
                 (DeepFrameBuffer *)Imf_3_2::Array2D<unsigned_int>::operator[](&local_78,0);
            in_stack_fffffffffffffc58 = 0;
            in_stack_fffffffffffffc50 = 0;
            Imf_3_2::Slice::Slice
                      (local_2f0,UINT,(char *)in_stack_fffffffffffffc70,4,(long)iVar4 << 2,1,1,0.0,
                       false,false);
            Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&stack0xfffffffffffffd50);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::pixelTypes,(long)(int)local_f8._12_4_);
            if (*pvVar10 == 0) {
              fillPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)in_stack_fffffffffffffc70,
                         (Array2D<unsigned_int_*> *)
                         CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                         in_stack_fffffffffffffc64,in_stack_fffffffffffffc60);
            }
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::pixelTypes,(long)(int)local_f8._12_4_);
            if (*pvVar10 == 1) {
              fillPixels<float>((Array2D<unsigned_int> *)in_stack_fffffffffffffc70,
                                (Array2D<float_*> *)
                                CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                in_stack_fffffffffffffc64,in_stack_fffffffffffffc60);
            }
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::pixelTypes,(long)(int)local_f8._12_4_);
            if (*pvVar10 == 2) {
              fillPixels<Imath_3_2::half>
                        ((Array2D<unsigned_int> *)in_stack_fffffffffffffc70,
                         (Array2D<Imath_3_2::half_*> *)
                         CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                         in_stack_fffffffffffffc64,in_stack_fffffffffffffc60);
            }
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                       (long)(int)local_f8._12_4_);
            setOutputDeepFrameBuffer
                      (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd40
                       ,in_stack_fffffffffffffd38,
                       (Array2D<Imath_3_2::half_*> *)in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd2c);
            Imf_3_2::DeepTiledOutputPart::setFrameBuffer((DeepFrameBuffer *)local_230);
            in_stack_fffffffffffffc6c = Imf_3_2::DeepTiledOutputPart::numXTiles((int)local_230);
            in_stack_fffffffffffffc64 = in_stack_fffffffffffffc6c + -1;
            in_stack_fffffffffffffc68 = Imf_3_2::DeepTiledOutputPart::numYTiles((int)local_230);
            Imf_3_2::DeepTiledOutputPart::writeTiles
                      ((int)local_230,0,in_stack_fffffffffffffc64,0,in_stack_fffffffffffffc68 + -1,
                       local_23c);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                       (long)(int)local_f8._12_4_);
            releasePixels((int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                          (Array2D<unsigned_int_*> *)
                          CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                          (Array2D<float_*> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          (Array2D<Imath_3_2::half_*> *)
                          CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                          in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
            Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1b9404);
          }
        }
      }
    }
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)(local_f8 + 0x10));
  std::vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>::~vector
            ((vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_> *)
             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imf_3_2::Array2D<unsigned_int_*>::~Array2D
            ((Array2D<unsigned_int_*> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  Imf_3_2::Array2D<float_*>::~Array2D
            ((Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  Imf_3_2::Array2D<Imath_3_2::half_*>::~Array2D
            ((Array2D<Imath_3_2::half_*> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  Imf_3_2::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))
  ;
  Imf_3_2::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))
  ;
  Imf_3_2::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  return;
}

Assistant:

void
generateRandomFile (int partCount)
{
    //
    // Init data.
    //
    Array2D<half>         halfData;
    Array2D<float>        floatData;
    Array2D<unsigned int> uintData;

    Array2D<unsigned int>  sampleCount;
    Array2D<half*>         deepHalfData;
    Array2D<float*>        deepFloatData;
    Array2D<unsigned int*> deepUintData;

    vector<GenericOutputFile*> outputfiles;

    pixelTypes.resize (partCount);
    partTypes.resize (partCount);
    levelModes.resize (partCount);

    //
    // Generate headers and data.
    //
    generateRandomHeaders (partCount, headers);

    remove (filename.c_str ());
    MultiPartOutputFile file (filename.c_str (), &headers[0], headers.size ());

    //
    // Writing files.
    //
    cout << "Writing files " << flush;

    //
    // Pre-generating frameBuffers.
    //
    for (int i = 0; i < partCount; i++)
    {
        switch (partTypes[i])
        {
            case 0: {
                OutputPart part (file, i);

                FrameBuffer frameBuffer;

                fillPixels<unsigned int> (uintData, width, height);
                fillPixels<float> (floatData, width, height);
                fillPixels<half> (halfData, width, height);

                setOutputFrameBuffer (
                    frameBuffer,
                    pixelTypes[i],
                    uintData,
                    floatData,
                    halfData,
                    width);

                part.setFrameBuffer (frameBuffer);

                part.writePixels (height);

                break;
            }
            case 1: {
                TiledOutputPart part (file, i);

                int numXLevels = part.numXLevels ();
                int numYLevels = part.numYLevels ();

                for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                    for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                    {
                        if (!part.isValidLevel (xLevel, yLevel)) continue;

                        int w = part.levelWidth (xLevel);
                        int h = part.levelHeight (yLevel);

                        FrameBuffer frameBuffer;

                        fillPixels<unsigned int> (uintData, w, h);
                        fillPixels<float> (floatData, w, h);
                        fillPixels<half> (halfData, w, h);
                        setOutputFrameBuffer (
                            frameBuffer,
                            pixelTypes[i],
                            uintData,
                            floatData,
                            halfData,
                            w);

                        part.setFrameBuffer (frameBuffer);

                        part.writeTiles (
                            0,
                            part.numXTiles (xLevel) - 1,
                            0,
                            part.numYTiles (yLevel) - 1,
                            xLevel,
                            yLevel);
                    }

                break;
            }
            case 2: {
                DeepScanLineOutputPart part (file, i);

                DeepFrameBuffer frameBuffer;

                sampleCount.resizeErase (height, width);
                for (int j = 0; j < height; j++)
                    for (int k = 0; k < width; k++)
                        sampleCount[j][k] = (j * width + k) % 10 + 1;

                frameBuffer.insertSampleCountSlice (Slice (
                    IMF::UINT,
                    (char*) (&sampleCount[0][0]),
                    sizeof (unsigned int) * 1,
                    sizeof (unsigned int) * width));

                if (pixelTypes[i] == 0)
                    fillPixels<unsigned int> (
                        sampleCount, deepUintData, width, height);
                if (pixelTypes[i] == 1)
                    fillPixels<float> (
                        sampleCount, deepFloatData, width, height);
                if (pixelTypes[i] == 2)
                    fillPixels<half> (sampleCount, deepHalfData, width, height);
                setOutputDeepFrameBuffer (
                    frameBuffer,
                    pixelTypes[i],
                    deepUintData,
                    deepFloatData,
                    deepHalfData,
                    width);

                part.setFrameBuffer (frameBuffer);

                part.writePixels (height);

                releasePixels (
                    pixelTypes[i],
                    deepUintData,
                    deepFloatData,
                    deepHalfData,
                    width,
                    height);

                break;
            }
            case 3: {
                DeepTiledOutputPart part (file, i);

                int numXLevels = part.numXLevels ();
                int numYLevels = part.numYLevels ();

                for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                    for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                    {
                        if (!part.isValidLevel (xLevel, yLevel)) continue;

                        int w = part.levelWidth (xLevel);
                        int h = part.levelHeight (yLevel);

                        DeepFrameBuffer frameBuffer;

                        sampleCount.resizeErase (h, w);
                        for (int j = 0; j < h; j++)
                            for (int k = 0; k < w; k++)
                                sampleCount[j][k] = (j * w + k) % 10 + 1;

                        frameBuffer.insertSampleCountSlice (Slice (
                            IMF::UINT,
                            (char*) (&sampleCount[0][0]),
                            sizeof (unsigned int) * 1,
                            sizeof (unsigned int) * w));

                        if (pixelTypes[i] == 0)
                            fillPixels<unsigned int> (
                                sampleCount, deepUintData, w, h);
                        if (pixelTypes[i] == 1)
                            fillPixels<float> (
                                sampleCount, deepFloatData, w, h);
                        if (pixelTypes[i] == 2)
                            fillPixels<half> (sampleCount, deepHalfData, w, h);
                        setOutputDeepFrameBuffer (
                            frameBuffer,
                            pixelTypes[i],
                            deepUintData,
                            deepFloatData,
                            deepHalfData,
                            w);

                        part.setFrameBuffer (frameBuffer);

                        part.writeTiles (
                            0,
                            part.numXTiles (xLevel) - 1,
                            0,
                            part.numYTiles (yLevel) - 1,
                            xLevel,
                            yLevel);

                        releasePixels (
                            pixelTypes[i],
                            deepUintData,
                            deepFloatData,
                            deepHalfData,
                            w,
                            h);
                    }

                break;
            }
        }
    }
}